

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_pwr.cpp
# Opt level: O0

uchar * sz_compress_2d_pwr<float>
                  (float *data,size_t r1,size_t r2,double precision,size_t *compressed_size,
                  int BSIZE,bool block_independant)

{
  float fVar1;
  ulong uVar2;
  size_t *in_RCX;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  byte in_R9B;
  float fVar3;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  uchar *final_compressed_pos;
  uchar *final_compressed;
  float threshold;
  size_t sign_size;
  uchar *log_compressed;
  size_t log_compressed_size;
  size_t i_2;
  double log_precision;
  size_t i_1;
  float *in_stack_00000068;
  float min_log_data;
  float max_abs_log_data;
  int i;
  float max_data;
  float min_data;
  uchar *signs;
  float *log_data;
  size_t num_elements;
  float local_b8;
  float local_b0;
  float local_ac;
  float *local_a8;
  float *local_a0;
  float local_94;
  long local_90;
  uchar *local_88;
  size_t local_80;
  ulong local_78;
  double local_70;
  ulong local_68;
  float local_5c;
  float local_58;
  int local_54;
  float local_50;
  float local_4c;
  uchar *local_48;
  void *local_40;
  size_t local_38;
  byte local_2d;
  size_t *local_28;
  double local_20;
  float *local_8;
  
  local_2d = in_R9B & 1;
  local_38 = in_RSI * in_RDX;
  local_28 = in_RCX;
  local_20 = in_XMM0_Qa;
  local_8 = in_RDI;
  local_40 = malloc(local_38 * 4);
  local_48 = (uchar *)malloc(local_38);
  memset(local_48,0,local_38);
  local_4c = *local_8;
  local_50 = *local_8;
  for (local_54 = 1; (ulong)(long)local_54 < local_38; local_54 = local_54 + 1) {
    if (local_8[local_54] <= local_4c) {
      local_ac = local_8[local_54];
    }
    else {
      local_ac = local_4c;
    }
    local_4c = local_ac;
    if (local_50 < local_8[local_54] || local_50 == local_8[local_54]) {
      local_b0 = local_8[local_54];
    }
    else {
      local_b0 = local_50;
    }
    local_50 = local_b0;
  }
  local_58 = 0.0;
  if ((local_4c != 0.0) || (NAN(local_4c))) {
    if ((local_50 != 0.0) || (NAN(local_50))) {
      dVar4 = std::fabs((double)(ulong)(uint)local_4c);
      dVar4 = std::log2(dVar4);
      dVar4 = std::fabs(dVar4);
      dVar5 = std::fabs((double)(ulong)(uint)local_50);
      dVar5 = std::log2(dVar5);
      dVar5 = std::fabs(dVar5);
      if (SUB84(dVar4,0) <= SUB84(dVar5,0)) {
        dVar4 = std::fabs((double)(ulong)(uint)local_50);
        dVar4 = std::log2(dVar4);
        dVar4 = std::fabs(dVar4);
        local_b8 = SUB84(dVar4,0);
      }
      else {
        dVar4 = std::fabs((double)(ulong)(uint)local_4c);
        dVar4 = std::log2(dVar4);
        dVar4 = std::fabs(dVar4);
        local_b8 = SUB84(dVar4,0);
      }
      local_58 = local_b8;
    }
    else {
      dVar4 = std::fabs((double)(ulong)(uint)local_4c);
      dVar4 = std::log2(dVar4);
      dVar4 = std::fabs(dVar4);
      local_58 = SUB84(dVar4,0);
    }
  }
  else {
    dVar4 = std::fabs((double)(ulong)(uint)local_50);
    dVar4 = std::log2(dVar4);
    dVar4 = std::fabs(dVar4);
    local_58 = SUB84(dVar4,0);
  }
  local_5c = local_58;
  for (local_68 = 0; local_68 < local_38; local_68 = local_68 + 1) {
    if (0.0 < local_8[local_68] || local_8[local_68] == 0.0) {
      *(float *)((long)local_40 + local_68 * 4) = local_8[local_68];
    }
    else {
      local_48[local_68] = '\x01';
      *(float *)((long)local_40 + local_68 * 4) = -local_8[local_68];
    }
    if (0.0 < *(float *)((long)local_40 + local_68 * 4)) {
      dVar4 = std::log2((double)(ulong)*(uint *)((long)local_40 + local_68 * 4));
      *(int *)((long)local_40 + local_68 * 4) = SUB84(dVar4,0);
      if (local_58 < *(float *)((long)local_40 + local_68 * 4)) {
        local_58 = *(float *)((long)local_40 + local_68 * 4);
      }
      if (*(float *)((long)local_40 + local_68 * 4) < local_5c) {
        local_5c = *(float *)((long)local_40 + local_68 * 4);
      }
    }
  }
  dVar4 = std::fabs((double)(ulong)(uint)local_5c);
  if (local_58 < SUB84(dVar4,0)) {
    dVar4 = std::fabs((double)(ulong)(uint)local_5c);
    local_58 = SUB84(dVar4,0);
  }
  dVar4 = log2(local_20 + 1.0);
  fVar1 = local_58;
  fVar3 = std::numeric_limits<float>::epsilon();
  local_70 = dVar4 - (double)(fVar1 * fVar3);
  for (local_78 = 0; local_78 < local_38; local_78 = local_78 + 1) {
    if ((local_8[local_78] == 0.0) && (!NAN(local_8[local_78]))) {
      *(float *)((long)local_40 + local_78 * 4) = (float)(local_70 * -2.0001 + (double)local_5c);
    }
  }
  local_80 = 0;
  local_88 = sz_compress_2d<float>
                       (in_stack_00000068,i_1,(size_t)log_precision,(double)i_2,
                        (size_t *)log_compressed_size,log_compressed._4_4_,log_compressed._3_1_);
  free(local_40);
  uVar2 = local_38 - 1 >> 3;
  local_90 = uVar2 + 1;
  local_94 = (float)(local_70 * -1.0001 + (double)local_5c);
  *local_28 = uVar2 + 5 + local_80;
  local_a0 = (float *)malloc(*local_28);
  *local_a0 = local_94;
  local_a8 = local_a0 + 1;
  convertIntArray2ByteArray_fast_1b_to_result_sz(local_48,local_38,(uchar **)&local_a8);
  memcpy(local_a8,local_88,local_80);
  free(local_48);
  free(local_88);
  return (uchar *)local_a0;
}

Assistant:

unsigned char *
sz_compress_2d_pwr(const T * data, size_t r1, size_t r2, double precision, size_t& compressed_size, int BSIZE, bool block_independant){
	size_t num_elements = r1 * r2;
	T * log_data = (T *) malloc(num_elements * sizeof(T));

	unsigned char * signs = (unsigned char *) malloc(num_elements);
	memset(signs, 0, num_elements);
	// preprocess
	T min_data = data[0];
	T max_data = data[0];
	for(int i=1; i<num_elements; i++){
		min_data = MIN(min_data, data[i]);
		max_data = MAX(max_data, data[i]);
	}
	T max_abs_log_data = 0;
    if(min_data == 0) max_abs_log_data = fabs(log2(fabs(max_data)));
    else if(max_data == 0) max_abs_log_data = fabs(log2(fabs(min_data)));
    else max_abs_log_data = fabs(log2(fabs(min_data))) > fabs(log2(fabs(max_data))) ? fabs(log2(fabs(min_data))) : fabs(log2(fabs(max_data)));
    T min_log_data = max_abs_log_data;
	for(size_t i=0; i<num_elements; i++){
		if(data[i] < 0){
			signs[i] = 1;
			log_data[i] = -data[i];
		}
		else
			log_data[i] = data[i];
		if(log_data[i] > 0){
			log_data[i] = log2(log_data[i]);
			if(log_data[i] > max_abs_log_data) max_abs_log_data = log_data[i];
			if(log_data[i] < min_log_data) min_log_data = log_data[i];
		}
	}
	if(fabs(min_log_data) > max_abs_log_data) max_abs_log_data = fabs(min_log_data);
	double log_precision = log2(1.0 + precision) - max_abs_log_data * std::numeric_limits<T>::epsilon();
	for(size_t i=0; i<num_elements; i++){
		if(data[i] == 0){
			log_data[i] = min_log_data - 2.0001*log_precision;
		}
	}
	size_t log_compressed_size = 0;
	unsigned char * log_compressed = sz_compress_2d(log_data, r1, r2, log_precision, log_compressed_size, BSIZE, block_independant);
    free(log_data);
	size_t sign_size = (num_elements-1)/8 + 1;
	T threshold = min_log_data - 1.0001*log_precision;
	compressed_size = sizeof(T) + sign_size + log_compressed_size;
    unsigned char * final_compressed = (unsigned char *) malloc(compressed_size);
    unsigned char * final_compressed_pos = final_compressed;
    memcpy(final_compressed_pos, &threshold, sizeof(T));
    final_compressed_pos += sizeof(T);
	convertIntArray2ByteArray_fast_1b_to_result_sz(signs, num_elements, final_compressed_pos);
	memcpy(final_compressed_pos, log_compressed, log_compressed_size);
	free(signs);
	free(log_compressed);
	return final_compressed;
}